

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  int iVar8;
  void *pvVar9;
  byte bVar10;
  uint uVar7;
  
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00111976:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
    goto LAB_00111976;
  }
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_001119a9:
    s->img_buffer = pbVar4 + 1;
    bVar10 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_001119a9;
    }
    bVar10 = 0;
  }
  uVar6 = 0;
  uVar7 = 0;
  if (1 < bVar10) goto LAB_001119bf;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_001119fd:
    s->img_buffer = pbVar4 + 1;
    bVar1 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_001119fd;
    }
    bVar1 = 0;
  }
  if (bVar10 == 1) {
    if ((bVar1 & 0xf7) != 1) goto LAB_001119bf;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00111aa1:
      s->img_buffer = s->img_buffer + 4;
    }
    else {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (3 < iVar2) goto LAB_00111aa1;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar2);
    }
    pbVar4 = s->img_buffer;
    if (pbVar4 < s->img_buffer_end) {
LAB_00111ad2:
      s->img_buffer = pbVar4 + 1;
      bVar1 = *pbVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar4 = s->img_buffer;
        goto LAB_00111ad2;
      }
      bVar1 = 0;
    }
    if ((0x20 < bVar1) || (uVar6 = uVar7, (0x101018100U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_001119bf;
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (iVar2 < 4) {
        s->img_buffer = s->img_buffer_end;
        pvVar9 = s->io_user_data;
        iVar8 = 4;
        goto LAB_00111b2b;
      }
    }
    s->img_buffer = s->img_buffer + 4;
  }
  else {
    uVar6 = uVar7;
    if ((bVar1 & 0xf6) != 2) goto LAB_001119bf;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00111b32:
      s->img_buffer = s->img_buffer + 9;
    }
    else {
      iVar2 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (8 < iVar2) goto LAB_00111b32;
      s->img_buffer = s->img_buffer_end;
      pvVar9 = s->io_user_data;
      iVar8 = 9;
LAB_00111b2b:
      (*(s->io).skip)(pvVar9,iVar8 - iVar2);
    }
  }
  iVar2 = stbi__get16le(s);
  uVar6 = uVar7;
  if (iVar2 == 0) goto LAB_001119bf;
  iVar2 = stbi__get16le(s);
  if (iVar2 == 0) goto LAB_001119bf;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00111b89:
    s->img_buffer = pbVar4 + 1;
    uVar5 = (ulong)*pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_00111b89;
    }
    uVar5 = 0;
  }
  if (bVar10 == 1) {
    uVar6 = (uint)(((byte)uVar5 - 8 & 0xf7) == 0);
  }
  else if (((byte)uVar5 < 0x21) && ((0x101018100U >> (uVar5 & 0x3f) & 1) != 0)) {
    uVar6 = 1;
  }
LAB_001119bf:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar6;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}